

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::AddPackage
          (DescriptorBuilder *this,string *name,Message *proto,FileDescriptor *file)

{
  Tables *pTVar1;
  FileDescriptor *descriptor;
  Message *element_name;
  bool bVar2;
  FileDescriptor *this_00;
  string *psVar3;
  Symbol SVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  Symbol existing_symbol;
  string local_68;
  string *local_48;
  string *parent_name;
  size_type dot_pos;
  anon_union_8_7_bfa3a334_for_Symbol_2 local_30;
  FileDescriptor *local_28;
  FileDescriptor *file_local;
  Message *proto_local;
  string *name_local;
  DescriptorBuilder *this_local;
  
  pTVar1 = this->tables_;
  local_28 = file;
  file_local = (FileDescriptor *)proto;
  proto_local = (Message *)name;
  name_local = (string *)this;
  anon_unknown_1::Symbol::Symbol((Symbol *)&dot_pos,file);
  SVar4._4_4_ = 0;
  SVar4.type = (uint)dot_pos;
  SVar4.field_1.descriptor = local_30.descriptor;
  bVar2 = DescriptorPool::Tables::AddSymbol(pTVar1,name,SVar4);
  if (bVar2) {
    parent_name = (string *)std::__cxx11::string::find_last_of((char)proto_local,0x2e);
    if (parent_name == (string *)0xffffffffffffffff) {
      ValidateSymbolName(this,(string *)proto_local,(string *)proto_local,(Message *)file_local);
    }
    else {
      pTVar1 = this->tables_;
      std::__cxx11::string::substr((ulong)&local_68,(ulong)proto_local);
      psVar3 = DescriptorPool::Tables::AllocateString(pTVar1,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      local_48 = psVar3;
      AddPackage(this,psVar3,(Message *)file_local,local_28);
      std::__cxx11::string::substr((ulong)&existing_symbol.field_1,(ulong)proto_local);
      ValidateSymbolName(this,(string *)&existing_symbol.field_1,(string *)proto_local,
                         (Message *)file_local);
      std::__cxx11::string::~string((string *)&existing_symbol.field_1);
    }
  }
  else {
    SVar4 = DescriptorPool::Tables::FindSymbol(this->tables_,(string *)proto_local);
    element_name = proto_local;
    descriptor = file_local;
    existing_symbol._0_8_ = SVar4.field_1;
    local_a8._0_4_ = SVar4.type;
    if (local_a8._0_4_ != PACKAGE) {
      std::operator+(&local_128,"\"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     proto_local);
      std::operator+(&local_108,&local_128,
                     "\" is already defined (as something other than a package) in file \"");
      this_00 = anon_unknown_1::Symbol::GetFile((Symbol *)local_a8);
      psVar3 = FileDescriptor::name_abi_cxx11_(this_00);
      std::operator+(&local_e8,&local_108,psVar3);
      std::operator+(&local_c8,&local_e8,"\".");
      AddError(this,(string *)element_name,(Message *)descriptor,NAME,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::AddPackage(
    const string& name, const Message& proto, const FileDescriptor* file) {
  if (tables_->AddSymbol(name, Symbol(file))) {
    // Success.  Also add parent package, if any.
    string::size_type dot_pos = name.find_last_of('.');
    if (dot_pos == string::npos) {
      // No parents.
      ValidateSymbolName(name, name, proto);
    } else {
      // Has parent.
      string* parent_name = tables_->AllocateString(name.substr(0, dot_pos));
      AddPackage(*parent_name, proto, file);
      ValidateSymbolName(name.substr(dot_pos + 1), name, proto);
    }
  } else {
    Symbol existing_symbol = tables_->FindSymbol(name);
    // It's OK to redefine a package.
    if (existing_symbol.type != Symbol::PACKAGE) {
      // Symbol seems to have been defined in a different file.
      AddError(name, proto, DescriptorPool::ErrorCollector::NAME,
               "\"" + name + "\" is already defined (as something other than "
               "a package) in file \"" + existing_symbol.GetFile()->name() +
               "\".");
    }
  }
}